

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O1

SlabThermodynamics * __thiscall
OpenMD::RNEMD::SPFMethod::calculateSlabTherodynamicQuantities
          (SlabThermodynamics *__return_storage_ptr__,SPFMethod *this,SelectionManager *sman)

{
  undefined4 *puVar1;
  double dVar2;
  int iVar3;
  undefined8 uVar4;
  uint i;
  StuntDouble *pSVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  double tmp;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int selei;
  Mat3x3d I;
  int local_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  double local_a8;
  double local_98 [4];
  double local_78 [8];
  double local_38;
  
  (__return_storage_ptr__->P).super_Vector<double,_3U>.data_[0] = 0.0;
  (__return_storage_ptr__->P).super_Vector<double,_3U>.data_[1] = 0.0;
  (__return_storage_ptr__->P).super_Vector<double,_3U>.data_[2] = 0.0;
  if (__return_storage_ptr__ != (SlabThermodynamics *)OpenMD::V3Zero) {
    (__return_storage_ptr__->P).super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
    uVar4 = OpenMD::V3Zero._8_8_;
    (__return_storage_ptr__->P).super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
    (__return_storage_ptr__->P).super_Vector<double,_3U>.data_[1] = (double)uVar4;
  }
  __return_storage_ptr__->M = 0.0;
  __return_storage_ptr__->K = 0.0;
  local_bc = 0;
  pSVar5 = SelectionManager::beginSelected(sman,&local_bc);
  if (pSVar5 != (StuntDouble *)0x0) {
    do {
      dVar2 = pSVar5->mass_;
      lVar6 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).velocity.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
      local_98[2] = (double)*(undefined8 *)(lVar6 + 0x10 + (long)pSVar5->localIndex_ * 0x18);
      pdVar8 = (double *)(lVar6 + (long)pSVar5->localIndex_ * 0x18);
      local_98[0] = *pdVar8;
      local_98[1] = pdVar8[1];
      local_78[0] = 0.0;
      local_78[1] = 0.0;
      local_78[2] = 0.0;
      lVar6 = 0;
      do {
        local_78[lVar6] = local_98[lVar6] * dVar2;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar6 = 0;
      do {
        (__return_storage_ptr__->P).super_Vector<double,_3U>.data_[lVar6] =
             local_78[lVar6] + (__return_storage_ptr__->P).super_Vector<double,_3U>.data_[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      __return_storage_ptr__->M = __return_storage_ptr__->M + dVar2;
      dVar10 = 0.0;
      lVar6 = 0;
      do {
        dVar10 = dVar10 + local_98[lVar6] * local_98[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      __return_storage_ptr__->K = dVar2 * dVar10 + __return_storage_ptr__->K;
      if (pSVar5->objType_ - otDAtom < 2) {
        lVar6 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).angularMomentum.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
        local_a8 = *(double *)(lVar6 + 0x10 + (long)pSVar5->localIndex_ * 0x18);
        puVar1 = (undefined4 *)(lVar6 + (long)pSVar5->localIndex_ * 0x18);
        local_b8 = *puVar1;
        uStack_b4 = puVar1[1];
        uStack_b0 = puVar1[2];
        uStack_ac = puVar1[3];
        (*pSVar5->_vptr_StuntDouble[5])(local_78,pSVar5);
        if (pSVar5->linear_ == true) {
          iVar3 = pSVar5->linearAxis_;
          uVar9 = (ulong)(((iVar3 + 1) / 3) * -3 + iVar3 + 1);
          uVar7 = (ulong)(iVar3 + ((iVar3 + 2) / 3) * -3 + 2);
          dVar2 = (*(double *)(&local_b8 + uVar9 * 2) * *(double *)(&local_b8 + uVar9 * 2)) /
                  local_78[uVar9 * 4];
          dVar10 = *(double *)(&local_b8 + uVar7 * 2) * *(double *)(&local_b8 + uVar7 * 2);
          pdVar8 = local_78 + uVar7 * 4;
        }
        else {
          auVar11._0_8_ =
               (double)CONCAT44(uStack_b4,local_b8) * (double)CONCAT44(uStack_b4,local_b8);
          auVar11._8_8_ =
               (double)CONCAT44(uStack_ac,uStack_b0) * (double)CONCAT44(uStack_ac,uStack_b0);
          auVar12._8_4_ = SUB84(local_78[4],0);
          auVar12._0_8_ = local_78[0];
          auVar12._12_4_ = (int)((ulong)local_78[4] >> 0x20);
          auVar12 = divpd(auVar11,auVar12);
          dVar2 = auVar12._8_8_ + auVar12._0_8_;
          dVar10 = local_a8 * local_a8;
          pdVar8 = &local_38;
        }
        __return_storage_ptr__->K = dVar10 / *pdVar8 + dVar2 + __return_storage_ptr__->K;
      }
      pSVar5 = SelectionManager::nextSelected(sman,&local_bc);
    } while (pSVar5 != (StuntDouble *)0x0);
  }
  __return_storage_ptr__->K = __return_storage_ptr__->K * 0.5;
  return __return_storage_ptr__;
}

Assistant:

SPFMethod::SlabThermodynamics SPFMethod::calculateSlabTherodynamicQuantities(
      SelectionManager& sman) {
    SlabThermodynamics slab {};

    int selei {}, selej {};

    StuntDouble* sd;

    for (sd = sman.beginSelected(selei); sd != NULL;
         sd = sman.nextSelected(selei)) {
      RealType mass = sd->getMass();
      Vector3d vel  = sd->getVel();

      slab.P += mass * vel;
      slab.M += mass;
      slab.K += mass * vel.lengthSquare();

      if (sd->isDirectional()) {
        Vector3d angMom = sd->getJ();
        Mat3x3d I       = sd->getI();
        if (sd->isLinear()) {
          int i = sd->linearAxis();
          int j = (i + 1) % 3;
          int k = (i + 2) % 3;
          slab.K +=
              angMom[j] * angMom[j] / I(j, j) + angMom[k] * angMom[k] / I(k, k);
        } else {
          slab.K += angMom[0] * angMom[0] / I(0, 0) +
                    angMom[1] * angMom[1] / I(1, 1) +
                    angMom[2] * angMom[2] / I(2, 2);
        }
      }
    }

    slab.K *= 0.5;

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &(slab.P[0]), 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &(slab.M), 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &(slab.K), 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    return slab;
  }